

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_xor(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  mp_limb_t *pmVar1;
  mp_limb_t *pmVar2;
  uint uVar3;
  int iVar4;
  mp_srcptr xp;
  mp_size_t mVar5;
  ulong uVar6;
  ulong uVar7;
  ulong n;
  uint uVar8;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  __mpz_struct *p_Var14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  mp_limb_t mVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar9;
  
  uVar8 = u->_mp_size;
  uVar16 = -uVar8;
  if (0 < (int)uVar8) {
    uVar16 = uVar8;
  }
  uVar8 = v->_mp_size;
  uVar3 = -uVar8;
  if (0 < (int)uVar8) {
    uVar3 = uVar8;
  }
  uVar7 = (ulong)uVar3;
  n = (ulong)uVar16;
  p_Var14 = v;
  if (uVar16 < uVar3) {
    n = uVar7;
    p_Var14 = u;
    uVar7 = (ulong)uVar16;
    u = v;
  }
  if (uVar7 == 0) {
    mpz_set(r,u);
    return;
  }
  uVar8 = (uint)u->_mp_size >> 0x1f;
  uVar9 = (ulong)uVar8;
  uVar16 = (uint)p_Var14->_mp_size >> 0x1f;
  uVar10 = (ulong)((uint)(p_Var14->_mp_size ^ u->_mp_size) >> 0x1f);
  if ((long)r->_mp_alloc < (long)(n + uVar10)) {
    xp = mpz_realloc(r,n + uVar10);
  }
  else {
    xp = r->_mp_d;
  }
  uVar6 = -uVar9;
  uVar12 = -uVar10;
  pmVar1 = u->_mp_d;
  pmVar2 = p_Var14->_mp_d;
  uVar11 = 0;
  uVar17 = (ulong)uVar16;
  do {
    uVar15 = uVar17;
    uVar17 = pmVar1[uVar11] ^ uVar6;
    uVar18 = uVar17 + uVar9;
    uVar9 = (ulong)CARRY8(uVar17,uVar9);
    uVar20 = pmVar2[uVar11] ^ -(ulong)uVar16;
    uVar21 = uVar20 + uVar15;
    uVar17 = uVar18 ^ uVar12 ^ uVar21;
    mVar19 = uVar17 + uVar10;
    uVar10 = (ulong)CARRY8(uVar17,uVar10);
    xp[uVar11] = mVar19;
    uVar11 = uVar11 + 1;
    uVar17 = (ulong)CARRY8(uVar20,uVar15);
  } while (uVar11 < uVar7);
  if (uVar21 < uVar15) {
    __assert_fail("vc == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0xef1,"void mpz_xor(__mpz_struct *, const __mpz_struct *, const __mpz_struct *)")
    ;
  }
  for (; uVar11 < n; uVar11 = uVar11 + 1) {
    uVar7 = pmVar1[uVar11] ^ uVar6;
    uVar17 = uVar7 + uVar9;
    uVar9 = (ulong)CARRY8(uVar7,uVar9);
    uVar17 = uVar17 ^ uVar6;
    mVar19 = uVar17 + uVar10;
    uVar10 = (ulong)CARRY8(uVar17,uVar10);
    xp[uVar11] = mVar19;
  }
  if (uVar10 == 0) {
    mVar5 = mpn_normalized_size(xp,n);
    iVar13 = (int)mVar5;
  }
  else {
    xp[n] = 1;
    iVar13 = (int)n + 1;
  }
  iVar4 = -iVar13;
  if (uVar8 == uVar16) {
    iVar4 = iVar13;
  }
  r->_mp_size = iVar4;
  return;
}

Assistant:

void
mpz_xor (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc ^ vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  rp = MPZ_REALLOC (r, un + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = (ul ^ vl ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < un; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = (ul ^ ux) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[un++] = rc;
  else
    un = mpn_normalized_size (rp, un);

  r->_mp_size = rx ? -un : un;
}